

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_choice.hpp
# Opt level: O0

result_type_conflict1 __thiscall
bcl::detail::random_choice_walker<unsigned_long,unsigned_int,double,void>::operator()
          (random_choice_walker<unsigned_long,_unsigned_int,_double,_void> *this,
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *eng)

{
  uint uVar1;
  uint uVar2;
  result_type rVar3;
  undefined4 *in_RDI;
  result_type_conflict1 x;
  uint in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  uVar2 = (uint)(rVar3 >> ((byte)*in_RDI & 0x3f));
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  uVar1 = random_choice_walker<unsigned_long,_unsigned_int,_double,_void>::cutoff
                    ((random_choice_walker<unsigned_long,_unsigned_int,_double,_void> *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc);
  if (uVar1 <= rVar3) {
    uVar2 = random_choice_walker<unsigned_long,_unsigned_int,_double,_void>::alias
                      ((random_choice_walker<unsigned_long,_unsigned_int,_double,_void> *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc);
  }
  return uVar2;
}

Assistant:

result_type operator()(Engine& eng) const {
    result_type x = eng() >> bits_;
    return (eng() < cutoff(x)) ? x : alias(x);
  }